

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

UBool __thiscall icu_63::TimeZoneFormat::operator==(TimeZoneFormat *this,Format *other)

{
  long lVar1;
  UChar32 *pUVar2;
  UBool UVar3;
  int iVar4;
  int32_t i_1;
  UnicodeString *this_00;
  int32_t i;
  ulong uVar5;
  UnicodeString *text;
  char cVar6;
  
  UVar3 = Locale::operator==(&this->fLocale,(Locale *)(other + 1));
  if (UVar3 != '\0') {
    UVar3 = UnicodeString::operator==
                      (&this->fGMTPattern,(UnicodeString *)(other[1].validLocale + 0x53));
    if (UVar3 != '\0') {
      UVar3 = UnicodeString::operator==
                        (&this->fGMTZeroFormat,(UnicodeString *)(other[3].actualLocale + 0x48));
      if (UVar3 != '\0') {
        iVar4 = (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[3])
                          (this->fTimeZoneNames,*(undefined8 *)(other[1].validLocale + 0x43));
        cVar6 = (char)iVar4 != '\0';
        goto LAB_002038f0;
      }
    }
  }
  cVar6 = false;
LAB_002038f0:
  this_00 = (UnicodeString *)&this->field_0x280;
  text = (UnicodeString *)(other[1].validLocale + 0x93);
  for (uVar5 = 0; (cVar6 != '\0' && (uVar5 < 6)); uVar5 = uVar5 + 1) {
    cVar6 = UnicodeString::operator==(this_00,text);
    text = text + 1;
    this_00 = this_00 + 1;
  }
  uVar5 = 0;
  while ((uVar5 < 10 && (cVar6 != '\0'))) {
    pUVar2 = this->fGMTOffsetDigits + uVar5;
    lVar1 = uVar5 * 4;
    uVar5 = uVar5 + 1;
    cVar6 = *pUVar2 == *(int *)(other[3].actualLocale + lVar1 + 0x20);
  }
  return cVar6;
}

Assistant:

UBool
TimeZoneFormat::operator==(const Format& other) const {
    TimeZoneFormat* tzfmt = (TimeZoneFormat*)&other;

    UBool isEqual =
            fLocale == tzfmt->fLocale
            && fGMTPattern == tzfmt->fGMTPattern
            && fGMTZeroFormat == tzfmt->fGMTZeroFormat
            && *fTimeZoneNames == *tzfmt->fTimeZoneNames;

    for (int32_t i = 0; i < UTZFMT_PAT_COUNT && isEqual; i++) {
        isEqual = fGMTOffsetPatterns[i] == tzfmt->fGMTOffsetPatterns[i];
    }
    for (int32_t i = 0; i < 10 && isEqual; i++) {
        isEqual = fGMTOffsetDigits[i] == tzfmt->fGMTOffsetDigits[i];
    }
    // TODO
    // Check fTimeZoneGenericNames. For now,
    // if fTimeZoneNames is same, fTimeZoneGenericNames should
    // be also equivalent.
    return isEqual;
}